

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void tplt_linedir(FILE *out,int lineno,char *filename)

{
  char cVar1;
  
  fprintf((FILE *)out,"#line %d \"",lineno);
  do {
    cVar1 = *filename;
    if (cVar1 == '\\') {
      putc(0x5c,(FILE *)out);
      cVar1 = *filename;
    }
    else if (cVar1 == '\0') {
      fwrite("\"\n",2,1,(FILE *)out);
      return;
    }
    putc((int)cVar1,(FILE *)out);
    filename = filename + 1;
  } while( true );
}

Assistant:

PRIVATE void tplt_linedir(FILE *out, int lineno, char *filename)
{
  fprintf(out,"#line %d \"",lineno);
  while( *filename ){
    if( *filename == '\\' ) putc('\\',out);
    putc(*filename,out);
    filename++;
  }
  fprintf(out,"\"\n");
}